

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O0

void __thiscall
crnlib::dxt_hc::create_alpha_selector_codebook_task(dxt_hc *this,uint64 data,void *pData_ptr)

{
  uint i;
  ulong uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  endpoint_indices_details *peVar6;
  alpha_cluster *paVar7;
  byte *pbVar8;
  unsigned_long_long *puVar9;
  alpha_selector_details *paVar10;
  selector_indices_details *psVar11;
  uint local_ae0;
  uint local_acc;
  uint local_ab4;
  uint local_aa8;
  uint local_aa4;
  uint s_4;
  uint p_3;
  uint (*total_errors) [16] [8];
  int delta_1;
  uint s_3;
  uint p_2;
  uint error;
  uint64 selector;
  uint s_2;
  uint best_error;
  uint best_index;
  uint s_1;
  uint p_1;
  int delta;
  uint s;
  uint p;
  uint *block_values;
  alpha_cluster *cluster;
  uint local_a48;
  uint alpha_pixel_comp;
  uint c;
  uint bEnd;
  uint b;
  uint n;
  uint E6 [8] [64];
  uint E3 [16] [8];
  uint num_tasks;
  vector<crnlib::alpha_selector_details> *selector_details;
  void *pData_ptr_local;
  uint64 data_local;
  dxt_hc *this_local;
  
  uVar2 = task_pool::get_num_threads(this->m_pTask_pool);
  if ((this->m_has_subblocks & 1U) == 0) {
    local_ab4 = this->m_num_blocks;
  }
  else {
    local_ab4 = this->m_num_blocks >> 1;
  }
  for (c = (uint)((local_ab4 * data) / (ulong)(uVar2 + 1));
      c < (uint)(((ulong)local_ab4 * (data + 1)) / (ulong)(uVar2 + 1)); c = c + 1) {
    for (local_a48 = 1; local_a48 < this->m_num_alpha_blocks + 1; local_a48 = local_a48 + 1) {
      i = (this->m_params).m_alpha_component_indices[local_a48 - 1];
      if ((this->m_has_subblocks & 1U) == 0) {
        local_acc = c;
      }
      else {
        local_acc = c << 1;
      }
      peVar6 = vector<crnlib::dxt_hc::endpoint_indices_details>::operator[]
                         (&this->m_endpoint_indices,local_acc);
      paVar7 = vector<crnlib::dxt_hc::alpha_cluster>::operator[]
                         (&this->m_alpha_clusters,(uint)(peVar6->field_0).component[local_a48]);
      for (delta = 0; (uint)delta < 0x10; delta = delta + 1) {
        for (p_1 = 0; p_1 < 8; p_1 = p_1 + 1) {
          pbVar8 = color_quad<unsigned_char,_int>::operator[](this->m_blocks[c] + (uint)delta,i);
          iVar3 = (uint)*pbVar8 - paVar7->alpha_values[p_1];
          E3[(ulong)(uint)delta - 1][(ulong)p_1 + 6] = iVar3 * iVar3;
        }
      }
      for (best_index = 0; best_index < 8; best_index = best_index + 1) {
        for (best_error = 0; best_error < 0x40; best_error = best_error + 1) {
          (&b)[(ulong)best_index * 0x40 + (ulong)best_error] =
               E3[(ulong)(best_index << 1) - 1][(ulong)(best_error & 7) + 6] +
               E3[(ulong)(best_index << 1 | 1) - 1][(ulong)(best_error >> 3) + 6];
        }
      }
      s_2 = 0;
      selector._4_4_ = 0xffffffff;
      for (selector._0_4_ = 0; uVar4 = vector<unsigned_long_long>::size(&this->m_alpha_selectors),
          (uint)selector < uVar4; selector._0_4_ = (uint)selector + 1) {
        puVar9 = vector<unsigned_long_long>::operator[](&this->m_alpha_selectors,(uint)selector);
        uVar1 = *puVar9;
        uVar5 = E3[-9][(uVar1 >> 0x2a & 0x3f) + 6] +
                E3[-0x11][(uVar1 >> 0x24 & 0x3f) + 6] +
                E3[-0x19][(uVar1 >> 0x1e & 0x3f) + 6] +
                E6[3][(uVar1 >> 0x18 & 0x3f) + 0x3e] +
                E6[2][(uVar1 >> 0x12 & 0x3f) + 0x3e] +
                E6[1][(uVar1 >> 0xc & 0x3f) + 0x3e] +
                E6[0][(uVar1 >> 6 & 0x3f) + 0x3e] + (&b)[uVar1 & 0x3f];
        if (uVar5 < selector._4_4_) {
          s_2 = (uint)selector;
          selector._4_4_ = uVar5;
        }
      }
      if ((paVar7->refined_alpha & 1U) != 0) {
        for (delta_1 = 0; (uint)delta_1 < 0x10; delta_1 = delta_1 + 1) {
          for (total_errors._4_4_ = 0; total_errors._4_4_ < 8;
              total_errors._4_4_ = total_errors._4_4_ + 1) {
            pbVar8 = color_quad<unsigned_char,_int>::operator[](this->m_blocks[c] + (uint)delta_1,i)
            ;
            iVar3 = (uint)*pbVar8 - paVar7->refined_alpha_values[total_errors._4_4_];
            E3[(ulong)(uint)delta_1 - 1][(ulong)total_errors._4_4_ + 6] = iVar3 * iVar3;
          }
        }
      }
      paVar10 = vector<crnlib::alpha_selector_details>::operator[]
                          ((vector<crnlib::alpha_selector_details> *)pData_ptr,s_2);
      for (local_aa4 = 0; local_aa4 < 0x10; local_aa4 = local_aa4 + 1) {
        for (local_aa8 = 0; local_aa8 < 8; local_aa8 = local_aa8 + 1) {
          paVar10->error[local_aa4][local_aa8] =
               E3[(ulong)local_aa4 - 1][(ulong)local_aa8 + 6] + paVar10->error[local_aa4][local_aa8]
          ;
        }
      }
      paVar10 = vector<crnlib::alpha_selector_details>::operator[]
                          ((vector<crnlib::alpha_selector_details> *)pData_ptr,s_2);
      paVar10->used = true;
      if ((this->m_has_subblocks & 1U) == 0) {
        local_ae0 = c;
      }
      else {
        local_ae0 = c << 1;
      }
      psVar11 = vector<crnlib::dxt_hc::selector_indices_details>::operator[]
                          (&this->m_selector_indices,local_ae0);
      (psVar11->field_0).component[local_a48] = (uint16)s_2;
    }
  }
  return;
}

Assistant:

void dxt_hc::create_alpha_selector_codebook_task(uint64 data, void* pData_ptr) {
  crnlib::vector<alpha_selector_details>& selector_details = *static_cast<crnlib::vector<alpha_selector_details>*>(pData_ptr);
  uint num_tasks = m_pTask_pool->get_num_threads() + 1;
  uint E3[16][8];
  uint E6[8][64];
  for (uint n = m_has_subblocks ? m_num_blocks >> 1 : m_num_blocks, b = n * data / num_tasks, bEnd = n * (data + 1) / num_tasks; b < bEnd; b++) {
    for (uint c = cAlpha0; c < cAlpha0 + m_num_alpha_blocks; c++) {
      const uint alpha_pixel_comp = m_params.m_alpha_component_indices[c - cAlpha0];
      alpha_cluster& cluster = m_alpha_clusters[m_endpoint_indices[m_has_subblocks ? b << 1 : b].component[c]];
      uint* block_values = cluster.alpha_values;
      for (uint p = 0; p < 16; p++) {
        for (uint s = 0; s < 8; s++) {
          int delta = m_blocks[b][p][alpha_pixel_comp] - block_values[s];
          E3[p][s] = delta * delta;
        }
      }
      for (uint p = 0; p < 8; p++) {
        for (uint s = 0; s < 64; s++)
          E6[p][s] = E3[p << 1][s & 7] + E3[p << 1 | 1][s >> 3];
      }
      uint best_index = 0;
      for (uint best_error = cUINT32_MAX, s = 0; s < m_alpha_selectors.size(); s++) {
        uint64 selector = m_alpha_selectors[s];
        uint error = E6[0][selector & 63];
        error += E6[1][selector >> 6 & 63];
        error += E6[2][selector >> 12 & 63];
        error += E6[3][selector >> 18 & 63];
        error += E6[4][selector >> 24 & 63];
        error += E6[5][selector >> 30 & 63];
        error += E6[6][selector >> 36 & 63];
        error += E6[7][selector >> 42 & 63];
        if (error < best_error) {
          best_error = error;
          best_index = s;
        }
      }
      if (cluster.refined_alpha) {
        block_values = cluster.refined_alpha_values;
        for (uint p = 0; p < 16; p++) {
          for (uint s = 0; s < 8; s++) {
            int delta = m_blocks[b][p][alpha_pixel_comp] - block_values[s];
            E3[p][s] = delta * delta;
          }
        }
      }
      uint (&total_errors)[16][8] = selector_details[best_index].error;
      for (uint p = 0; p < 16; p++) {
        for (uint s = 0; s < 8; s++)
         total_errors[p][s] += E3[p][s];
      }
      selector_details[best_index].used = true;
      m_selector_indices[m_has_subblocks ? b << 1 : b].component[c] = best_index;
    }
  }
}